

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall
cmCTest::GenerateCTestNotesOutput
          (cmCTest *this,cmXMLWriter *xml,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var3;
  long lVar4;
  bool bVar5;
  undefined8 *puVar6;
  long *plVar7;
  ostream *poVar8;
  size_type *psVar9;
  ulong *puVar10;
  undefined8 uVar11;
  pointer value;
  string note_time;
  string buildname;
  ostringstream cmCTestLog_msg_1;
  ifstream ifs;
  string local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  pointer local_3d8;
  string local_3d0;
  string local_3b0 [3];
  ios_base local_340 [264];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  paVar1 = &local_3b0[0].field_2;
  local_3b0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"BuildName","");
  GetCTestConfiguration(&local_238,this,local_3b0);
  SafeBuildIdField(&local_3d0,&local_238);
  paVar2 = &local_238.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::StartDocument(xml,"UTF-8");
  cmXMLWriter::ProcessingInstruction
            (xml,"xml-stylesheet",
             "type=\"text/xsl\" href=\"Dart/Source/Server/XSL/Build.xsl <file:///Dart/Source/Server/XSL/Build.xsl> \""
            );
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Site","");
  cmXMLWriter::StartElement(xml,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"BuildName",&local_3d0);
  _Var3._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  lVar4 = *(long *)&((_Var3._M_head_impl)->CurrentTag)._M_dataplus;
  local_3b0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b0,lVar4,
             *(size_type *)((long)&(_Var3._M_head_impl)->CurrentTag + 8) + lVar4);
  std::__cxx11::string::append((char *)local_3b0);
  GetTestModelString_abi_cxx11_(&local_418,this);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != paVar1) {
    uVar11 = local_3b0[0].field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_418._M_string_length + local_3b0[0]._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      uVar11 = local_418.field_2._M_allocated_capacity;
    }
    if (local_418._M_string_length + local_3b0[0]._M_string_length <= (ulong)uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_418,0,(char *)0x0,(ulong)local_3b0[0]._M_dataplus._M_p);
      goto LAB_0016920d;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)local_3b0,(ulong)local_418._M_dataplus._M_p);
LAB_0016920d:
  psVar9 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_238.field_2._M_allocated_capacity = *psVar9;
    local_238.field_2._8_8_ = puVar6[3];
    local_238._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_238.field_2._M_allocated_capacity = *psVar9;
    local_238._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_238._M_string_length = puVar6[1];
  *puVar6 = psVar9;
  puVar6[1] = 0;
  *(undefined1 *)psVar9 = 0;
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"BuildStamp",&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1);
  }
  local_3b0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"Site","");
  GetCTestConfiguration(&local_238,this,local_3b0);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"Name",&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1);
  }
  local_3b0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"ctest-","");
  cmVersion::GetCMakeVersion();
  plVar7 = (long *)std::__cxx11::string::append((char *)local_3b0);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_238.field_2._M_allocated_capacity = *psVar9;
    local_238.field_2._8_8_ = plVar7[3];
    local_238._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_238.field_2._M_allocated_capacity = *psVar9;
    local_238._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_238._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"Generator",&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1);
  }
  AddSiteProperties(this,xml);
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Notes","");
  cmXMLWriter::StartElement(xml,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  value = (files->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  local_3d8 = (files->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (value != local_3d8) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"\tAdd file: ",0xb);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_238,(value->_M_dataplus)._M_p,value->_M_string_length);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x603,local_3b0[0]._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      CurrentTime_abi_cxx11_(&local_418,this);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Note","");
      cmXMLWriter::StartElement(xml,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,"Name",value);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Time","");
      local_3b0[0]._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
      cmXMLWriter::
      Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                (xml,&local_238,
                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)local_3b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"DateTime","");
      cmXMLWriter::StartElement(xml,&local_238);
      cmXMLWriter::Content<std::__cxx11::string>(xml,&local_418);
      cmXMLWriter::EndElement(xml);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Text","");
      cmXMLWriter::StartElement(xml,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::ifstream::ifstream(&local_238,(value->_M_dataplus)._M_p,_S_in);
      if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        local_3b0[0]._M_string_length = 0;
        local_3b0[0].field_2._M_allocated_capacity =
             local_3b0[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        while( true ) {
          bVar5 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&local_238,local_3b0,(bool *)0x0,0xffffffffffffffff);
          if (!bVar5) break;
          cmXMLWriter::Content<std::__cxx11::string>(xml,local_3b0);
          cmXMLWriter::Content<char[2]>(xml,(char (*) [2])0x79b535);
        }
        std::ifstream::close();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
          operator_delete(local_3b0[0]._M_dataplus._M_p,
                          local_3b0[0].field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::operator+(&local_3f8,"Problem reading file: ",value);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_3f8);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        puVar10 = (ulong *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_3b0[0].field_2._0_8_ = *puVar10;
          local_3b0[0].field_2._8_8_ = plVar7[3];
        }
        else {
          local_3b0[0].field_2._0_8_ = *puVar10;
          local_3b0[0]._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_3b0[0]._M_string_length = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        cmXMLWriter::Content<std::__cxx11::string>(xml,local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
          operator_delete(local_3b0[0]._M_dataplus._M_p,
                          local_3b0[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b0,"Problem reading file: ",0x16);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_3b0,(value->_M_dataplus)._M_p,value->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," while creating notes",0x15);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x616,local_3f8._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        std::ios_base::~ios_base(local_340);
      }
      cmXMLWriter::EndElement(xml);
      cmXMLWriter::EndElement(xml);
      std::ifstream::~ifstream(&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
      }
      value = value + 1;
    } while (value != local_3d8);
  }
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndDocument(xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  return 1;
}

Assistant:

int cmCTest::GenerateCTestNotesOutput(cmXMLWriter& xml,
                                      std::vector<std::string> const& files)
{
  std::string buildname =
    cmCTest::SafeBuildIdField(this->GetCTestConfiguration("BuildName"));
  xml.StartDocument();
  xml.ProcessingInstruction("xml-stylesheet",
                            "type=\"text/xsl\" "
                            "href=\"Dart/Source/Server/XSL/Build.xsl "
                            "<file:///Dart/Source/Server/XSL/Build.xsl> \"");
  xml.StartElement("Site");
  xml.Attribute("BuildName", buildname);
  xml.Attribute("BuildStamp",
                this->Impl->CurrentTag + "-" + this->GetTestModelString());
  xml.Attribute("Name", this->GetCTestConfiguration("Site"));
  xml.Attribute("Generator",
                std::string("ctest-") + cmVersion::GetCMakeVersion());
  this->AddSiteProperties(xml);
  xml.StartElement("Notes");

  for (std::string const& file : files) {
    cmCTestLog(this, OUTPUT, "\tAdd file: " << file << std::endl);
    std::string note_time = this->CurrentTime();
    xml.StartElement("Note");
    xml.Attribute("Name", file);
    xml.Element("Time", std::chrono::system_clock::now());
    xml.Element("DateTime", note_time);
    xml.StartElement("Text");
    cmsys::ifstream ifs(file.c_str());
    if (ifs) {
      std::string line;
      while (cmSystemTools::GetLineFromStream(ifs, line)) {
        xml.Content(line);
        xml.Content("\n");
      }
      ifs.close();
    } else {
      xml.Content("Problem reading file: " + file + "\n");
      cmCTestLog(this, ERROR_MESSAGE,
                 "Problem reading file: " << file << " while creating notes"
                                          << std::endl);
    }
    xml.EndElement(); // Text
    xml.EndElement(); // Note
  }
  xml.EndElement(); // Notes
  xml.EndElement(); // Site
  xml.EndDocument();
  return 1;
}